

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadMultiChannelEXRFromFile(EXRImage *exrImage,char *filename,char **err)

{
  reference __ptr;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  undefined8 *in_RDX;
  char *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  size_t filesize;
  FILE *fp;
  char **in_stack_000003f8;
  uchar *in_stack_00000400;
  EXRImage *in_stack_00000408;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  allocator_type *in_stack_ffffffffffffff70;
  size_type __n;
  undefined4 in_stack_ffffffffffffff80;
  int __whence;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_30;
  FILE *local_28;
  undefined8 *local_20;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  int local_4;
  
  if (in_RDI == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
    if (in_RDX != (undefined8 *)0x0) {
      *in_RDX = "Invalid argument.";
    }
    local_4 = -1;
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RDI;
    local_28 = fopen(in_RSI,"rb");
    if (local_28 == (FILE *)0x0) {
      if (local_20 != (undefined8 *)0x0) {
        *local_20 = "Cannot read file.";
      }
      local_4 = -1;
    }
    else {
      __whence = 0;
      __n = 0;
      fseek(local_28,0,2);
      local_30 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)ftell(local_28);
      fseek(local_28,__n,__whence);
      std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x2872fb);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT44(__whence,in_stack_ffffffffffffff80),__n,in_stack_ffffffffffffff70);
      std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x28731b);
      __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_48,0);
      this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             fread(__ptr,1,(size_t)local_30,local_28);
      if (this != local_30) {
        __assert_fail("ret == filesize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/yymmaa0000[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x234f,
                      "int LoadMultiChannelEXRFromFile(EXRImage *, const char *, const char **)");
      }
      fclose(local_28);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                (local_10,CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_4 = LoadMultiChannelEXRFromMemory(in_stack_00000408,in_stack_00000400,in_stack_000003f8)
      ;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
    }
  }
  return local_4;
}

Assistant:

int LoadMultiChannelEXRFromFile(EXRImage *exrImage, const char *filename,
                                const char **err) {
  if (exrImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadMultiChannelEXRFromMemory(exrImage, &buf.at(0), err);
}